

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv6Transmitter::ProcessAddAcceptIgnoreEntry
          (RTPUDPv6Transmitter *this,in6_addr ip,uint16_t port)

{
  size_t *psVar1;
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar2;
  RTPMemoryManager *pRVar3;
  _List_node_base *p_Var4;
  HashElement *pHVar5;
  byte bVar6;
  PortInfo *pPVar7;
  _List_node_base *p_Var8;
  HashElement *pHVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint8_t local_38;
  uint8_t uStack_37;
  uint8_t uStack_36;
  uint8_t uStack_35;
  uint8_t uStack_34;
  uint8_t uStack_33;
  uint8_t uStack_32;
  uint8_t uStack_31;
  uint8_t uStack_30;
  uint8_t uStack_2f;
  uint8_t uStack_2e;
  uint8_t uStack_2d;
  uint8_t uStack_2c;
  uint8_t uStack_2b;
  uint8_t uStack_2a;
  
  bVar6 = ip.__in6_u._15_1_;
  uVar10 = ((uint)bVar6 |
           ip.__in6_u._12_4_ >> 8 & 0xff00 |
           ip.__in6_u._11_4_ & 0xff0000 | ip.__in6_u._9_4_ & 0xff000000) % 0x207d;
  pHVar9 = (this->acceptignoreinfo).table[uVar10];
  (this->acceptignoreinfo).curhashelem = pHVar9;
  while( true ) {
    local_38 = ip.__in6_u._0_1_;
    uStack_37 = ip.__in6_u._1_1_;
    uStack_36 = ip.__in6_u._2_1_;
    uStack_35 = ip.__in6_u._3_1_;
    uStack_34 = ip.__in6_u._4_1_;
    uStack_33 = ip.__in6_u._5_1_;
    uStack_32 = ip.__in6_u._6_1_;
    uStack_31 = ip.__in6_u._7_1_;
    uStack_30 = ip.__in6_u._8_1_;
    uStack_2f = ip.__in6_u._9_1_;
    uStack_2e = ip.__in6_u._10_1_;
    uStack_2d = ip.__in6_u._11_1_;
    uStack_2c = ip.__in6_u._12_1_;
    uStack_2b = ip.__in6_u._13_1_;
    uStack_2a = ip.__in6_u._14_1_;
    if (pHVar9 == (HashElement *)0x0) {
      pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar3 == (RTPMemoryManager *)0x0) {
        pPVar7 = (PortInfo *)operator_new(0x20);
      }
      else {
        pPVar7 = (PortInfo *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,0x20,0xc);
      }
      plVar2 = &pPVar7->portlist;
      (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
      (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
      (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      _M_node._M_size = 0;
      pPVar7->all = false;
      if (port == 0) {
        pPVar7->all = true;
      }
      else {
        p_Var8 = (_List_node_base *)operator_new(0x18);
        *(uint16_t *)&p_Var8[1]._M_next = port;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar1 = &(pPVar7->portlist).
                  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
                  _M_size;
        *psVar1 = *psVar1 + 1;
      }
      pHVar9 = (this->acceptignoreinfo).table[uVar10];
      while( true ) {
        if (pHVar9 == (HashElement *)0x0) {
          pRVar3 = (this->acceptignoreinfo).super_RTPMemoryObject.mgr;
          if (pRVar3 == (RTPMemoryManager *)0x0) {
            pHVar9 = (HashElement *)operator_new(0x40);
          }
          else {
            pHVar9 = (HashElement *)
                     (**(code **)(*(long *)pRVar3 + 0x10))
                               (pRVar3,0x40,(this->acceptignoreinfo).memorytype);
          }
          *(long *)&(pHVar9->key).__in6_u = ip.__in6_u._0_8_;
          *(long *)((long)&(pHVar9->key).__in6_u + 8) = ip.__in6_u._8_8_;
          pHVar9->element = pPVar7;
          pHVar9->hashprev = (HashElement *)0x0;
          pHVar9->hashnext = (HashElement *)0x0;
          pHVar9->listprev = (HashElement *)0x0;
          pHVar9->listnext = (HashElement *)0x0;
          pHVar9->hashindex = uVar10;
          pHVar5 = (this->acceptignoreinfo).table[uVar10];
          (this->acceptignoreinfo).table[uVar10] = pHVar9;
          pHVar9->hashnext = pHVar5;
          if (pHVar5 != (HashElement *)0x0) {
            pHVar5->hashprev = pHVar9;
          }
          if ((this->acceptignoreinfo).firsthashelem == (HashElement *)0x0) {
            (this->acceptignoreinfo).firsthashelem = pHVar9;
          }
          else {
            pHVar5 = (this->acceptignoreinfo).lasthashelem;
            pHVar5->listnext = pHVar9;
            pHVar9->listprev = pHVar5;
          }
          (this->acceptignoreinfo).lasthashelem = pHVar9;
          return 0;
        }
        auVar12[0] = -((pHVar9->key).__in6_u.__u6_addr8[0] == local_38);
        auVar12[1] = -((pHVar9->key).__in6_u.__u6_addr8[1] == uStack_37);
        auVar12[2] = -((pHVar9->key).__in6_u.__u6_addr8[2] == uStack_36);
        auVar12[3] = -((pHVar9->key).__in6_u.__u6_addr8[3] == uStack_35);
        auVar12[4] = -((pHVar9->key).__in6_u.__u6_addr8[4] == uStack_34);
        auVar12[5] = -((pHVar9->key).__in6_u.__u6_addr8[5] == uStack_33);
        auVar12[6] = -((pHVar9->key).__in6_u.__u6_addr8[6] == uStack_32);
        auVar12[7] = -((pHVar9->key).__in6_u.__u6_addr8[7] == uStack_31);
        auVar12[8] = -((pHVar9->key).__in6_u.__u6_addr8[8] == uStack_30);
        auVar12[9] = -((pHVar9->key).__in6_u.__u6_addr8[9] == uStack_2f);
        auVar12[10] = -((pHVar9->key).__in6_u.__u6_addr8[10] == uStack_2e);
        auVar12[0xb] = -((pHVar9->key).__in6_u.__u6_addr8[0xb] == uStack_2d);
        auVar12[0xc] = -((pHVar9->key).__in6_u.__u6_addr8[0xc] == uStack_2c);
        auVar12[0xd] = -((pHVar9->key).__in6_u.__u6_addr8[0xd] == uStack_2b);
        auVar12[0xe] = -((pHVar9->key).__in6_u.__u6_addr8[0xe] == uStack_2a);
        auVar12[0xf] = -((pHVar9->key).__in6_u.__u6_addr8[0xf] == bVar6);
        if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar12[0xf] >> 7) << 0xf) == 0xffff) break;
        pHVar9 = pHVar9->hashnext;
      }
      pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      p_Var8 = (plVar2->super__List_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               _M_node.super__List_node_base._M_next;
      if (pRVar3 == (RTPMemoryManager *)0x0) {
        while (p_Var8 != (_List_node_base *)plVar2) {
          p_Var4 = p_Var8->_M_next;
          operator_delete(p_Var8,0x18);
          p_Var8 = p_Var4;
        }
        operator_delete(pPVar7,0x20);
      }
      else {
        while (p_Var8 != (_List_node_base *)plVar2) {
          p_Var4 = p_Var8->_M_next;
          operator_delete(p_Var8,0x18);
          p_Var8 = p_Var4;
        }
        (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3,pPVar7);
      }
      return -9;
    }
    auVar11[0] = -(local_38 == (pHVar9->key).__in6_u.__u6_addr8[0]);
    auVar11[1] = -(uStack_37 == (pHVar9->key).__in6_u.__u6_addr8[1]);
    auVar11[2] = -(uStack_36 == (pHVar9->key).__in6_u.__u6_addr8[2]);
    auVar11[3] = -(uStack_35 == (pHVar9->key).__in6_u.__u6_addr8[3]);
    auVar11[4] = -(uStack_34 == (pHVar9->key).__in6_u.__u6_addr8[4]);
    auVar11[5] = -(uStack_33 == (pHVar9->key).__in6_u.__u6_addr8[5]);
    auVar11[6] = -(uStack_32 == (pHVar9->key).__in6_u.__u6_addr8[6]);
    auVar11[7] = -(uStack_31 == (pHVar9->key).__in6_u.__u6_addr8[7]);
    auVar11[8] = -(uStack_30 == (pHVar9->key).__in6_u.__u6_addr8[8]);
    auVar11[9] = -(uStack_2f == (pHVar9->key).__in6_u.__u6_addr8[9]);
    auVar11[10] = -(uStack_2e == (pHVar9->key).__in6_u.__u6_addr8[10]);
    auVar11[0xb] = -(uStack_2d == (pHVar9->key).__in6_u.__u6_addr8[0xb]);
    auVar11[0xc] = -(uStack_2c == (pHVar9->key).__in6_u.__u6_addr8[0xc]);
    auVar11[0xd] = -(uStack_2b == (pHVar9->key).__in6_u.__u6_addr8[0xd]);
    auVar11[0xe] = -(uStack_2a == (pHVar9->key).__in6_u.__u6_addr8[0xe]);
    auVar11[0xf] = -(bVar6 == (pHVar9->key).__in6_u.__u6_addr8[0xf]);
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
                ) == 0xffff) break;
    pHVar9 = pHVar9->hashnext;
    (this->acceptignoreinfo).curhashelem = pHVar9;
  }
  pPVar7 = pHVar9->element;
  if (port == 0) {
    pPVar7->all = true;
    std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar7->portlist);
    return 0;
  }
  if (pPVar7->all != false) {
    return 0;
  }
  p_Var8 = (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    if (p_Var8 == (_List_node_base *)&pPVar7->portlist) {
      p_Var8 = (_List_node_base *)operator_new(0x18);
      *(uint16_t *)&p_Var8[1]._M_next = port;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      psVar1 = &(pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      return 0;
    }
    if (*(uint16_t *)&((_List_node_base *)((long)p_Var8 + 0x10))->_M_next == port) break;
    p_Var8 = p_Var8->_M_next;
  }
  return 0;
}

Assistant:

int RTPUDPv6Transmitter::ProcessAddAcceptIgnoreEntry(in6_addr ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (acceptignoreinfo.HasCurrentElement()) // An entry for this IP address already exists
	{
		PortInfo *portinf = acceptignoreinfo.GetCurrentElement();
		
		if (port == 0) // select all ports
		{
			portinf->all = true;
			portinf->portlist.clear();
		}
		else if (!portinf->all)
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = portinf->portlist.begin();
			end = portinf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list
					return 0;
			}
			portinf->portlist.push_front(port);
		}
	}
	else // got to create an entry for this IP address
	{
		PortInfo *portinf;
		int status;
		
		portinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_ACCEPTIGNOREPORTINFO) PortInfo();
		if (port == 0) // select all ports
			portinf->all = true;
		else
			portinf->portlist.push_front(port);
		
		status = acceptignoreinfo.AddElement(ip,portinf);
		if (status < 0)
		{
			RTPDelete(portinf,GetMemoryManager());
			return status;
		}
	}
	return 0;
}